

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BindingRenderCase::init
          (BindingRenderCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  RenderTarget *pRVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  TestError *this_01;
  int local_e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (0x3f < pRVar2->m_width) {
    pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (0x3f < pRVar2->m_height) {
      iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x708))(1,&this->m_vao);
      iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      iVar1 = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
      if (iVar1 == 0) {
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
        iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
        return iVar1;
      }
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"could not gen vao",(allocator<char> *)&local_b8);
      tcu::TestError::TestError(this_01,&local_d8);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_e0[1] = 0x40;
  de::toString<int>(&local_78,local_e0 + 1);
  std::operator+(&local_58,"Test requires at least ",&local_78);
  std::operator+(&local_38,&local_58,"x");
  local_e0[0] = 0x40;
  de::toString<int>(&local_98,local_e0);
  std::operator+(&local_b8,&local_38,&local_98);
  std::operator+(&local_d8,&local_b8," render target");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_d8);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BindingRenderCase::init (void)
{
	// check requirements
	if (m_context.getRenderTarget().getWidth() < TEST_RENDER_SIZE || m_context.getRenderTarget().getHeight() < TEST_RENDER_SIZE)
		throw tcu::NotSupportedError("Test requires at least " + de::toString<int>(TEST_RENDER_SIZE) + "x" + de::toString<int>(TEST_RENDER_SIZE) + " render target");

	// resources
	m_context.getRenderContext().getFunctions().genVertexArrays(1, &m_vao);
	if (m_context.getRenderContext().getFunctions().getError() != GL_NO_ERROR)
		throw tcu::TestError("could not gen vao");

	createBuffers();
	createShader();
}